

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O3

bool anon_unknown.dwarf_19f832d::HandleGetCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  cmMakefile *this;
  bool bVar2;
  long lVar3;
  pointer pbVar4;
  ulong uVar5;
  string *name;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string_view value;
  string_view value_00;
  vector<int,_std::allocator<int>_> indexes;
  int index;
  cmList values;
  optional<cmList> list;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_d8;
  iterator iStack_d0;
  int *local_c8;
  int local_bc;
  string local_b8;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  char *local_80;
  undefined8 local_78;
  undefined1 local_70 [32];
  _Storage<cmList,_false> local_50;
  char local_38;
  
  pbVar4 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if ((ulong)((long)pbVar1 - (long)pbVar4) < 0x80) {
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b8,"sub-command GET requires at least three arguments.","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    bVar2 = false;
  }
  else {
    name = pbVar1 + -1;
    GetList((optional<cmList> *)&local_50._M_value,pbVar4 + 1,status->Makefile);
    if (local_38 == '\0') {
      bVar2 = true;
      value._M_str = "NOTFOUND";
      value._M_len = 8;
      cmMakefile::AddDefinition(status->Makefile,name,value);
    }
    else if (local_50._M_value.Values.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start ==
             local_50._M_value.Values.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish) {
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"GET given empty list","")
      ;
      std::__cxx11::string::_M_assign((string *)&status->Error);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      bVar2 = false;
    }
    else {
      local_d8._M_current = (int *)0x0;
      iStack_d0._M_current = (int *)0x0;
      local_c8 = (int *)0x0;
      pbVar4 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (((long)(args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4 >> 5) - 4U <
          0xfffffffffffffffd) {
        uVar5 = 2;
        lVar3 = 0x40;
        do {
          bVar2 = GetIndexArg((string *)((long)&(pbVar4->_M_dataplus)._M_p + lVar3),&local_bc,
                              status->Makefile);
          if (!bVar2) {
            pbVar4 = (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            local_b8._M_dataplus._M_p = (pointer)0x7;
            local_b8._M_string_length = 0x9177f9;
            local_b8.field_2._M_allocated_capacity = 0;
            local_98 = *(undefined8 *)((long)&(pbVar4->_M_dataplus)._M_p + lVar3);
            local_b8.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->_M_string_length + lVar3);
            local_90 = 0;
            local_88 = 0x15;
            local_80 = " is not a valid index";
            local_78 = 0;
            views._M_len = 3;
            views._M_array = (iterator)&local_b8;
            cmCatViews((string *)local_70,views);
            std::__cxx11::string::_M_assign((string *)&status->Error);
            if ((pointer)local_70._0_8_ != (pointer)(local_70 + 0x10)) {
              operator_delete((void *)local_70._0_8_,(ulong)(local_70._16_8_ + 1));
            }
            bVar2 = false;
            goto LAB_00487028;
          }
          if (iStack_d0._M_current == local_c8) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_d8,iStack_d0,&local_bc);
          }
          else {
            *iStack_d0._M_current = local_bc;
            iStack_d0._M_current = iStack_d0._M_current + 1;
          }
          uVar5 = uVar5 + 1;
          pbVar4 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          lVar3 = lVar3 + 0x20;
        } while (uVar5 < ((long)(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4 >> 5) -
                         1U);
      }
      cmList::get_items<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                ((cmList *)local_70,&local_50._M_value,local_d8,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 iStack_d0._M_current);
      this = status->Makefile;
      cmList::to_string_abi_cxx11_(&local_b8,(cmList *)local_70);
      value_00._M_str = local_b8._M_dataplus._M_p;
      value_00._M_len = local_b8._M_string_length;
      cmMakefile::AddDefinition(this,name,value_00);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_70);
      bVar2 = true;
LAB_00487028:
      if (local_d8._M_current != (int *)0x0) {
        operator_delete(local_d8._M_current,(long)local_c8 - (long)local_d8._M_current);
      }
    }
    if (local_38 == '\x01') {
      local_38 = 0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_50._M_value.Values);
    }
  }
  return bVar2;
}

Assistant:

bool HandleGetCommand(std::vector<std::string> const& args,
                      cmExecutionStatus& status)
{
  if (args.size() < 4) {
    status.SetError("sub-command GET requires at least three arguments.");
    return false;
  }

  const std::string& listName = args[1];
  const std::string& variableName = args.back();
  // expand the variable
  auto list = GetList(listName, status.GetMakefile());
  if (!list) {
    status.GetMakefile().AddDefinition(variableName, "NOTFOUND");
    return true;
  }
  // FIXME: Add policy to make non-existing lists an error like empty lists.
  if (list->empty()) {
    status.SetError("GET given empty list");
    return false;
  }

  std::vector<int> indexes;
  for (std::size_t cc = 2; cc < args.size() - 1; cc++) {
    int index;
    if (!GetIndexArg(args[cc], &index, status.GetMakefile())) {
      status.SetError(cmStrCat("index: ", args[cc], " is not a valid index"));
      return false;
    }
    indexes.push_back(index);
  }

  try {
    auto values = list->get_items(indexes.begin(), indexes.end());
    status.GetMakefile().AddDefinition(variableName, values.to_string());
    return true;
  } catch (std::out_of_range& e) {
    status.SetError(e.what());
    return false;
  }
}